

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inc_densities.c
# Opt level: O2

int inc_densities(float32 ***new_mixw,vector_t ***new_mean,vector_t ***new_var,
                 vector_t ****new_fullvar,float32 ***mixw,vector_t ***mean,vector_t ***var,
                 vector_t ****fullvar,float32 ***dnom,uint32 n_mixw,uint32 n_mgau,uint32 n_dnom,
                 uint32 n_feat,uint32 n_density,uint32 *veclen,uint32 n_inc)

{
  vector_t ***ppppfVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  float32 *pfVar5;
  vector_t *ppfVar6;
  void *pvVar7;
  vector_t ***ppppfVar8;
  ulong uVar9;
  uint uVar10;
  uint32 uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  void *__src;
  ulong uVar16;
  vector_t pfVar17;
  vector_t pfVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  
  if (n_mgau >= n_mixw && n_mgau != n_mixw) {
    __assert_fail("n_mgau <= n_mixw",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                  ,0x60,
                  "int inc_densities(float32 ***, vector_t ***, vector_t ***, vector_t ****, float32 ***, vector_t ***, vector_t ***, vector_t ****, float32 ***, uint32, uint32, uint32, uint32, uint32, const uint32 *, uint32)"
                 );
  }
  if (n_mgau < n_mixw) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
            ,99,"Splitting of the tied mixture gaussians is not yet implemented\n");
    exit(1);
  }
  for (uVar19 = 0; uVar19 != n_mgau; uVar19 = uVar19 + 1) {
    for (uVar20 = 0; uVar20 != n_feat; uVar20 = uVar20 + 1) {
      for (lVar15 = 0; (ulong)n_density * 4 - lVar15 != 0; lVar15 = lVar15 + 4) {
        memcpy(*(void **)((long)new_mean[uVar19][uVar20] + lVar15 * 2),
               *(void **)((long)mean[uVar19][uVar20] + lVar15 * 2),(ulong)veclen[uVar20] << 2);
        if (fullvar == (vector_t ****)0x0) {
          pvVar7 = *(void **)((long)new_var[uVar19][uVar20] + lVar15 * 2);
          __src = *(void **)((long)var[uVar19][uVar20] + lVar15 * 2);
          uVar10 = veclen[uVar20];
        }
        else {
          pvVar7 = (void *)**(undefined8 **)((long)new_fullvar[uVar19][uVar20] + lVar15 * 2);
          __src = (void *)**(undefined8 **)((long)fullvar[uVar19][uVar20] + lVar15 * 2);
          uVar10 = veclen[uVar20] * veclen[uVar20];
        }
        memcpy(pvVar7,__src,(ulong)uVar10 << 2);
        *(undefined4 *)((long)new_mixw[uVar19][uVar20] + lVar15) =
             *(undefined4 *)((long)mixw[uVar19][uVar20] + lVar15);
      }
    }
  }
  pvVar7 = __ckd_calloc_2d__((ulong)n_feat,(ulong)n_inc,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                             ,0x80);
  uVar19 = 0;
  do {
    if (uVar19 == n_mgau) {
      return 0;
    }
    printf("%u:",uVar19 & 0xffffffff);
    fflush(_stdout);
    ppppfVar1 = var + uVar19;
    lVar15 = 0;
    for (uVar20 = 0; uVar20 != n_inc; uVar20 = uVar20 + 1) {
      uVar10 = n_density + (int)uVar20;
      for (uVar21 = 0; uVar21 != n_feat; uVar21 = uVar21 + 1) {
        lVar4 = *(long *)((long)pvVar7 + uVar21 * 8);
        *(uint32 *)(lVar4 + uVar20 * 4) = n_density;
        fVar23 = -1.0;
        uVar11 = n_density;
        for (uVar13 = 0; uVar13 != n_density; uVar13 = uVar13 + 1) {
          fVar22 = (float)dnom[uVar19][uVar21][uVar13];
          uVar16 = 0xffffffffffffffff;
          if (fVar23 < fVar22) {
            do {
              if (lVar15 + uVar16 == -1) goto LAB_00102b91;
              lVar3 = uVar16 * 4;
              uVar16 = uVar16 + 1;
            } while (uVar13 != *(uint *)(lVar4 + 4 + lVar3));
            if (uVar20 <= uVar16) {
LAB_00102b91:
              uVar11 = (uint32)uVar13;
              fVar23 = fVar22;
            }
          }
        }
        uVar13 = (ulong)uVar11;
        pfVar2 = (float *)(dnom[uVar19][uVar21] + uVar13);
        if (1.2e-38 < *pfVar2 || *pfVar2 == 1.2e-38) {
          pfVar5 = new_mixw[uVar19][uVar21];
          fVar22 = (float)pfVar5[uVar13];
          pfVar5[uVar13] = (float32)(fVar22 * 0.5);
          pfVar5[uVar10] = (float32)(fVar22 * 0.5);
          if (fullvar == (vector_t ****)0x0) {
            pfVar18 = new_var[uVar19][uVar21][uVar10];
            pfVar17 = (*ppppfVar1)[uVar21][uVar13];
            uVar12 = veclen[uVar21];
          }
          else {
            pfVar18 = *new_fullvar[uVar19][uVar21][uVar10];
            pfVar17 = *fullvar[uVar19][uVar21][uVar13];
            uVar12 = veclen[uVar21] * veclen[uVar21];
          }
          memcpy(pfVar18,pfVar17,(ulong)uVar12 << 2);
          for (uVar16 = 0; uVar16 < veclen[uVar21]; uVar16 = uVar16 + 1) {
            ppppfVar8 = ppppfVar1;
            uVar9 = uVar21;
            uVar14 = uVar13;
            if (fullvar != (vector_t ****)0x0) {
              ppppfVar8 = fullvar[uVar19] + uVar21;
              uVar9 = uVar13;
              uVar14 = uVar16;
            }
            fVar22 = (*ppppfVar8)[uVar9][uVar14][uVar16];
            if (fVar22 < 0.0) {
              fVar22 = sqrtf(fVar22);
            }
            else {
              fVar22 = SQRT(fVar22);
            }
            pfVar18 = mean[uVar19][uVar21][uVar13];
            ppfVar6 = new_mean[uVar19][uVar21];
            ppfVar6[uVar13][uVar16] = fVar22 * 0.2 + pfVar18[uVar16];
            ppfVar6[uVar10][uVar16] = fVar22 * -0.2 + pfVar18[uVar16];
          }
          *(uint32 *)(*(long *)((long)pvVar7 + uVar21 * 8) + uVar20 * 4) = uVar11;
          printf("%u(%.2e)",(double)fVar23,(ulong)uVar11);
          fflush(_stdout);
        }
        else {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/inc_densities.c"
                  ,0x94,"(mgau= %u, feat= %u, density= %u) never observed skipping\n",
                  uVar19 & 0xffffffff,uVar21 & 0xffffffff,n_density);
          new_mixw[uVar19][uVar21][uVar10] = 0.0;
          if (fullvar == (vector_t ****)0x0) {
            pfVar18 = new_var[uVar19][uVar21][uVar10];
            pfVar17 = *(*ppppfVar1)[uVar21];
            uVar12 = veclen[uVar21];
          }
          else {
            pfVar18 = *new_fullvar[uVar19][uVar21][uVar10];
            pfVar17 = **fullvar[uVar19][uVar21];
            uVar12 = veclen[uVar21] * veclen[uVar21];
          }
          memcpy(pfVar18,pfVar17,(ulong)uVar12 << 2);
          memcpy(new_mean[uVar19][uVar21][uVar10],*mean[uVar19][uVar21],(ulong)veclen[uVar21] << 2);
        }
      }
      lVar15 = lVar15 + -1;
    }
    putchar(10);
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

int
inc_densities(float32 ***new_mixw,
	      vector_t ***new_mean,
	      vector_t ***new_var,
	      vector_t ****new_fullvar,

	      float32 ***mixw,
	      vector_t ***mean,
	      vector_t ***var,
	      vector_t ****fullvar,
	      float32 ***dnom,
	      
	      uint32 n_mixw,
	      uint32 n_mgau,
	      uint32 n_dnom,
	      uint32 n_feat,
	      uint32 n_density,
	      const uint32 *veclen,
	      uint32 n_inc)
{
    uint32 i, j, k, l, r;
    uint32 **did;
    float32 max_wt;
    uint32 max_wt_idx;
    float32 std;

    assert(n_mgau <= n_mixw);
    
    if (n_mgau < n_mixw) {
	E_FATAL("Splitting of the tied mixture gaussians is not yet implemented\n");
    }

    /* copy old parameters into new arrays */
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		memcpy(new_mean[i][j][k], mean[i][j][k], veclen[j]*sizeof(float32));
		if (fullvar)
		    memcpy(new_fullvar[i][j][k][0], fullvar[i][j][k][0],
			   veclen[j]*veclen[j]*sizeof(float32));
		else
		    memcpy(new_var[i][j][k], var[i][j][k], veclen[j]*sizeof(float32));
		new_mixw[i][j][k] = mixw[i][j][k];
	    }
	}
    }

    /* Over all mixtures:
     * 	- Find the largest unsplit component density.
     *		- Split it into two components where the new component
     *			mixw_a = mixw_b = 1/2 mixw
     *			mean_a = mean + 0.2 std
     *			mean_b = mean - 0.2 std
     *			var_a = var_b = var
     *
     * New parameters are placed beginning at index n_density
     */

    did = (uint32 **)ckd_calloc_2d(n_feat, n_inc, sizeof(uint32));

    for (i = 0; i < n_mgau; i++) {
	printf("%u:", i);
	fflush(stdout);
	
	for (r = 0; r < n_inc; r++) {
	    for (j = 0; j < n_feat; j++) {
		did[j][r] = n_density;

		/* find the density w/ the largest EM count not yet split (i.e. most probable, most occurances) */
		for (k = 0, max_wt = -1.0, max_wt_idx = n_density; k < n_density; k++) {
		    if ((max_wt < dnom[i][j][k]) && not_done(k, did[j], r)) {
			max_wt = dnom[i][j][k];
			max_wt_idx = k;
		    }
		}

		if ( dnom[i][j][max_wt_idx] < MIN_IEEE_NORM_POS_FLOAT32 ) {
		    E_WARN("(mgau= %u, feat= %u, density= %u) never observed skipping\n",
			   i, j, k);

		    new_mixw[i][j][n_density+r] = 0;

		    if (fullvar)
			memcpy(new_fullvar[i][j][n_density+r][0], fullvar[i][j][0][0],
			       veclen[j]*veclen[j]*sizeof(float32));
		    else 
			memcpy(new_var[i][j][n_density+r], var[i][j][0],
			       veclen[j]*sizeof(float32));

		    memcpy(new_mean[i][j][n_density+r], mean[i][j][0],
			   veclen[j]*sizeof(float32));

		    continue;
		}

		/* mixing weight of prior and new densities == 1/2 prior mixing weight */
		new_mixw[i][j][max_wt_idx] /= 2;
		new_mixw[i][j][n_density+r] = new_mixw[i][j][max_wt_idx];

		/* Keep variance of new class same as old */
		if (fullvar)
		    memcpy(new_fullvar[i][j][n_density+r][0], fullvar[i][j][max_wt_idx][0],
			   veclen[j]*veclen[j]*sizeof(float32));
		else
		    memcpy(new_var[i][j][n_density+r], var[i][j][max_wt_idx],
			   veclen[j]*sizeof(float32));

		/* mean_a = mean + 0.2 std */
		/* mean_b = mean - 0.2 std */
		for (l = 0; l < veclen[j]; l++) {
		    /* Use the stddev of mean[l] itself for full covariances. */
		    if (fullvar)
			std = (float32)sqrt(fullvar[i][j][max_wt_idx][l][l]);
		    else
			std = (float32)sqrt(var[i][j][max_wt_idx][l]);
		    
		    new_mean[i][j][max_wt_idx][l] = mean[i][j][max_wt_idx][l] + 0.2f * std;
		    new_mean[i][j][n_density+r][l]  = mean[i][j][max_wt_idx][l] - 0.2f * std;
		}

		did[j][r] = max_wt_idx;
		printf("%u(%.2e)", did[j][r], max_wt);
		fflush(stdout);
	    }
	}
	printf("\n");
    }
	    

    return S3_SUCCESS;
}